

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O1

int main_body<dynet::GRUBuilder>(variables_map *vm)

{
  variables_map *this;
  _Base_ptr p_Var1;
  LookupParameter *pLVar2;
  float fVar3;
  uint uVar4;
  int iVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pcVar9;
  pointer piVar10;
  pointer piVar11;
  int iVar12;
  __pid_t _Var13;
  tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int> *sent;
  const_iterator cVar14;
  any *paVar15;
  uint *puVar16;
  const_iterator cVar17;
  const_iterator cVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  ostream *poVar20;
  pointer ptVar21;
  pointer ptVar22;
  void *pvVar23;
  Trainer *sgd;
  float *pfVar24;
  Trainer *pTVar25;
  int *piVar26;
  char *pcVar27;
  _Alloc_hider _Var28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  key_type local_770;
  byte local_749;
  _Base_ptr local_748;
  ulong local_740;
  ulong local_738;
  _Base_ptr local_730;
  undefined1 *local_728 [2];
  undefined1 local_718 [16];
  Corpus local_708;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  local_6e8;
  Corpus local_6c8;
  string fname;
  string flavour;
  undefined1 local_658 [32];
  key_type local_638;
  int *local_618 [2];
  int local_608 [4];
  string local_5f8;
  Model model;
  undefined7 uStack_5d7;
  pointer local_5c8 [15];
  string local_550;
  string local_530;
  key_type local_510;
  key_type local_4f0;
  key_type local_4d0;
  key_type local_4b0;
  string line;
  key_type local_470;
  AttentionalModel<dynet::GRUBuilder> am;
  
  pLVar2 = &am.p_ct;
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"<s>","");
  kSRC_SOS = dynet::Dict::convert(&sd,(string *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"</s>","");
  kSRC_EOS = dynet::Dict::convert(&sd,(string *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"<s>","");
  kTGT_SOS = dynet::Dict::convert(&td,(string *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"</s>","");
  kTGT_EOS = dynet::Dict::convert(&td,(string *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"verbose","");
  this = vm + 0x10;
  cVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  p_Var1 = (_Base_ptr)(vm + 0x18);
  verbose = cVar14._M_node != p_Var1;
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"layers","");
  paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  puVar16 = (uint *)boost::any_cast<int_const&>(paVar15);
  LAYERS = *puVar16;
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"align","");
  paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  puVar16 = (uint *)boost::any_cast<int_const&>(paVar15);
  ALIGN_DIM = *puVar16;
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"hidden","");
  paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  puVar16 = (uint *)boost::any_cast<int_const&>(paVar15);
  HIDDEN_DIM = *puVar16;
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"bidirectional","");
  local_730 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"giza","");
  cVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  local_740 = CONCAT71(local_740._1_7_,1);
  local_738._0_1_ = 1;
  if (cVar14._M_node == p_Var1) {
    local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"gz-position","");
    cVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,&local_638);
    local_738._0_1_ = cVar17._M_node != p_Var1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._M_dataplus._M_p != &local_638.field_2) {
      operator_delete(local_638._M_dataplus._M_p);
    }
    local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"gz-markov","");
    cVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,&local_638);
    local_740 = CONCAT71(local_740._1_7_,cVar17._M_node != p_Var1);
  }
  local_749 = true;
  if (cVar14._M_node == p_Var1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._M_dataplus._M_p != &local_638.field_2) {
      operator_delete(local_638._M_dataplus._M_p);
    }
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"gz-fertility","");
    cVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,&local_470);
    local_749 = cVar17._M_node != p_Var1;
  }
  if ((cVar14._M_node == p_Var1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2)) {
    operator_delete(local_470._M_dataplus._M_p);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"fertility","");
  cVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"swap","");
  cVar17 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"document","");
  local_748 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  flavour._M_dataplus._M_p = (pointer)&flavour.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&flavour,"RNN","");
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"lstm","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  if (cVar18._M_node == p_Var1) {
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"gru","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,(key_type *)&am);
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
    if (cVar18._M_node != p_Var1) {
      pcVar27 = "GRU";
      goto LAB_001281d3;
    }
  }
  else {
    pcVar27 = "LSTM";
LAB_001281d3:
    std::__cxx11::string::_M_replace
              ((ulong)&flavour,0,(char *)flavour._M_string_length,(ulong)pcVar27);
  }
  local_6c8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_708.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_708.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_708.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Reading training data from ",0x1b);
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"train","");
  paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  pbVar19 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
  poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(pbVar19->_M_dataplus)._M_p,pbVar19->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,"...\n",4);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"train","");
  paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  pbVar19 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
  read_corpus((Corpus *)local_658,pbVar19,local_748 != p_Var1);
  local_5c8[0] = local_6c8.
                 super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  _model = local_6c8.
           super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_6c8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_658._0_8_;
  local_6c8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_658._8_8_;
  local_6c8.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_658._16_8_;
  local_658._0_8_ = (pointer)0x0;
  local_658._8_8_ = (pointer)0x0;
  local_658._16_8_ = (pointer)0x0;
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             *)&model);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             *)local_658);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  sd.frozen = true;
  td.frozen = true;
  SRC_VOCAB_SIZE =
       (uint)((ulong)((long)sd.words_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)sd.words_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  TGT_VOCAB_SIZE =
       (uint)((ulong)((long)td.words_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)td.words_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"devel","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  if (cVar18._M_node != p_Var1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Reading dev data from ",0x16);
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"devel","");
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pbVar19 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(pbVar19->_M_dataplus)._M_p,pbVar19->_M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"...\n",4);
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"devel","");
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pbVar19 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
    read_corpus((Corpus *)local_658,pbVar19,local_748 != p_Var1);
    local_5c8[0] = local_708.
                   super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    _model = local_708.
             super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_708.
    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_658._0_8_;
    local_708.
    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_658._8_8_;
    local_708.
    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_658._16_8_;
    local_658._0_8_ = (pointer)0x0;
    local_658._8_8_ = (pointer)0x0;
    local_658._16_8_ = (pointer)0x0;
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               *)&model);
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               *)local_658);
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"test","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  if (cVar18._M_node == p_Var1) {
    bVar29 = false;
  }
  else {
    local_658._0_8_ = local_658 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"rescore","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,(key_type *)local_658);
    bVar29 = cVar18._M_node != p_Var1;
    if ((pointer)local_658._0_8_ != (pointer)(local_658 + 0x10)) {
      operator_delete((void *)local_658._0_8_);
    }
  }
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  if (bVar29) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Reading test examples from ",0x1b);
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"test","");
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pbVar19 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(pbVar19->_M_dataplus)._M_p,pbVar19->_M_string_length
                        );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
    std::ostream::put((char)poVar20);
    std::ostream::flush();
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"test","");
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pbVar19 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
    read_corpus((Corpus *)&fname,pbVar19,local_748 != p_Var1);
    local_5c8[0] = local_6e8.
                   super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    _model = local_6e8.
             super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_6e8.
    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)fname._M_dataplus._M_p;
    local_6e8.
    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)fname._M_string_length;
    local_6e8.
    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)fname.field_2._M_allocated_capacity;
    fname._M_dataplus._M_p = (pointer)0x0;
    fname._M_string_length = 0;
    fname.field_2._M_allocated_capacity = 0;
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               *)&model);
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               *)&fname);
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
  }
  if (cVar17._M_node != p_Var1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Swapping role of source and target\n",0x23);
    std::swap<dynet::Dict>(&sd,&td);
    iVar12 = kSRC_EOS;
    iVar5 = kSRC_SOS;
    uVar4 = SRC_VOCAB_SIZE;
    kSRC_SOS = kTGT_SOS;
    kTGT_SOS = iVar5;
    kSRC_EOS = kTGT_EOS;
    kTGT_EOS = iVar12;
    SRC_VOCAB_SIZE = TGT_VOCAB_SIZE;
    TGT_VOCAB_SIZE = uVar4;
    for (ptVar22 = local_6c8.
                   super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ptVar21 = local_708.
                  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        ptVar22 !=
        local_6c8.
        super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; ptVar22 = ptVar22 + 1) {
      piVar6 = (ptVar22->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar7 = (ptVar22->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      piVar8 = (ptVar22->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      piVar10 = (ptVar22->
                super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar11 = *(pointer *)
                 ((long)&(ptVar22->
                         super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                         ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                         super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>.
                         _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 8);
      (ptVar22->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           *(pointer *)
            ((long)&(ptVar22->
                    super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                    ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                    super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 0x10);
      (ptVar22->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
      super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           piVar6;
      *(pointer *)
       ((long)&(ptVar22->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
               super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 8) =
           piVar7;
      *(pointer *)
       ((long)&(ptVar22->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
               super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 0x10)
           = piVar8;
      (ptVar22->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           piVar10;
      (ptVar22->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           piVar11;
    }
    for (; ptVar22 = local_6e8.
                     super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
        ptVar21 !=
        local_708.
        super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; ptVar21 = ptVar21 + 1) {
      piVar6 = (ptVar21->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar7 = (ptVar21->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      piVar8 = (ptVar21->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      piVar10 = (ptVar21->
                super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar11 = *(pointer *)
                 ((long)&(ptVar21->
                         super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                         ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                         super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>.
                         _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 8);
      (ptVar21->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           *(pointer *)
            ((long)&(ptVar21->
                    super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                    ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                    super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 0x10);
      (ptVar21->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
      super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           piVar6;
      *(pointer *)
       ((long)&(ptVar21->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
               super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 8) =
           piVar7;
      *(pointer *)
       ((long)&(ptVar21->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
               super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 0x10)
           = piVar8;
      (ptVar21->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           piVar10;
      (ptVar21->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           piVar11;
    }
    for (; ptVar22 !=
           local_6e8.
           super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; ptVar22 = ptVar22 + 1) {
      piVar6 = (ptVar22->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar7 = (ptVar22->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      piVar8 = (ptVar22->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      piVar10 = (ptVar22->
                super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar11 = *(pointer *)
                 ((long)&(ptVar22->
                         super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                         ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                         super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>.
                         _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 8);
      (ptVar22->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           *(pointer *)
            ((long)&(ptVar22->
                    super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                    ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                    super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 0x10);
      (ptVar22->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
      super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           piVar6;
      *(pointer *)
       ((long)&(ptVar22->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
               super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 8) =
           piVar7;
      *(pointer *)
       ((long)&(ptVar22->
               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
               ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
               super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 0x10)
           = piVar8;
      (ptVar22->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           piVar10;
      (ptVar22->
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           piVar11;
    }
  }
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_allocated_capacity = fname.field_2._M_allocated_capacity & 0xffffffffffffff00;
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"parameters","");
  cVar17 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  bVar29 = (bool)(undefined1)local_738;
  local_738 = local_740 & 0xff;
  local_740 = (ulong)local_749;
  if (cVar17._M_node == p_Var1) {
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"initialise","");
    cVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,(key_type *)&am);
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
    if (cVar17._M_node != p_Var1) {
      am._0_8_ = pLVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&am,"initialise","");
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
      boost::any_cast<std::__cxx11::string_const&>(paVar15);
      std::__cxx11::string::_M_assign((string *)&fname);
      goto joined_r0x00128a14;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&am);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&am,"am",2);
    model = (Model)0x5f;
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&am,(char *)&model,1);
    poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
    model = (Model)0x5f;
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>(poVar20,(char *)&model,1);
    poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
    model = (Model)0x5f;
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>(poVar20,(char *)&model,1);
    poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
    _model = (pointer)CONCAT71(uStack_5d7,0x5f);
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>(poVar20,(char *)&model,1);
    poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar20,flavour._M_dataplus._M_p,flavour._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"_b",2);
    poVar20 = std::ostream::_M_insert<bool>(SUB81(poVar20,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"_g",2);
    pvVar23 = (void *)std::ostream::operator<<(poVar20,(uint)bVar29);
    pvVar23 = (void *)std::ostream::operator<<(pvVar23,(int)local_738);
    poVar20 = (ostream *)std::ostream::operator<<(pvVar23,(int)local_740);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"_d",2);
    poVar20 = std::ostream::_M_insert<bool>(SUB81(poVar20,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"-pid",4);
    _Var13 = getpid();
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,_Var13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,".params",7);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&fname,(string *)&model);
    if (_model != (pointer)local_5c8) {
      operator_delete(_model);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&am);
    std::ios_base::~ios_base((ios_base *)&am.p_Wa);
  }
  else {
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"parameters","");
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    boost::any_cast<std::__cxx11::string_const&>(paVar15);
    std::__cxx11::string::_M_assign((string *)&fname);
joined_r0x00128a14:
    if ((LookupParameter *)am._0_8_ != pLVar2) {
      operator_delete((void *)am._0_8_);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Parameters will be written to: ",0x1f);
  poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,fname._M_dataplus._M_p,fname._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
  std::ostream::put((char)poVar20);
  std::ostream::flush();
  dynet::Model::Model(&model);
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"sgd_trainer","");
  paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  puVar16 = boost::any_cast<unsigned_int_const&>(paVar15);
  uVar4 = *puVar16;
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  switch(uVar4) {
  case 0:
    sgd = (Trainer *)operator_new(0x40);
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"lr_eta","");
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pfVar24 = boost::any_cast<float_const&>(paVar15);
    fVar3 = *pfVar24;
    *(float *)(sgd + 8) = fVar3;
    *(float *)(sgd + 0xc) = fVar3;
    *(undefined8 *)(sgd + 0x10) = 0;
    sgd[0x18] = (Trainer)0x1;
    *(undefined4 *)(sgd + 0x1c) = 0x40a00000;
    *(undefined8 *)(sgd + 0x20) = 0;
    *(undefined8 *)(sgd + 0x28) = 0;
    *(undefined2 *)(sgd + 0x30) = 1;
    *(Model **)(sgd + 0x38) = &model;
    *(code **)sgd = std::streambuf::xsgetn;
    goto joined_r0x00128f09;
  case 1:
    sgd = (Trainer *)operator_new(0x78);
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"lr_eta","");
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pfVar24 = boost::any_cast<float_const&>(paVar15);
    fVar3 = *pfVar24;
    *(float *)(sgd + 8) = fVar3;
    *(float *)(sgd + 0xc) = fVar3;
    *(undefined8 *)(sgd + 0x10) = 0;
    sgd[0x18] = (Trainer)0x1;
    *(undefined4 *)(sgd + 0x1c) = 0x40a00000;
    auVar32._0_12_ = ZEXT812(0);
    auVar32._12_4_ = 0;
    *(undefined1 (*) [16])(sgd + 0x20) = auVar32;
    *(undefined2 *)(sgd + 0x30) = 1;
    *(Model **)(sgd + 0x38) = &model;
    *(code **)sgd = dynet::expr::rectify;
    *(undefined4 *)(sgd + 0x40) = 0x3f666666;
    *(undefined1 (*) [32])(sgd + 0x48) = ZEXT432(0);
    *(undefined1 (*) [32])(sgd + 0x58) = ZEXT432(0);
    goto joined_r0x00128e57;
  case 2:
    sgd = (Trainer *)operator_new(0x78);
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"lr_eta","");
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pfVar24 = boost::any_cast<float_const&>(paVar15);
    fVar3 = *pfVar24;
    *(float *)(sgd + 8) = fVar3;
    *(float *)(sgd + 0xc) = fVar3;
    *(undefined8 *)(sgd + 0x10) = 0;
    sgd[0x18] = (Trainer)0x1;
    *(undefined4 *)(sgd + 0x1c) = 0x40a00000;
    auVar31._0_12_ = ZEXT812(0);
    auVar31._12_4_ = 0;
    *(undefined1 (*) [16])(sgd + 0x20) = auVar31;
    *(undefined2 *)(sgd + 0x30) = 1;
    *(Model **)(sgd + 0x38) = &model;
    *(code **)sgd = dynet::expr::operator+;
    *(undefined4 *)(sgd + 0x40) = 0x1e3ce508;
    *(undefined1 (*) [32])(sgd + 0x48) = ZEXT432(0);
    *(undefined1 (*) [32])(sgd + 0x58) = ZEXT432(0);
joined_r0x00128f09:
    if ((LookupParameter *)am._0_8_ != pLVar2) {
LAB_0012902e:
      operator_delete((void *)am._0_8_);
    }
    break;
  case 3:
    sgd = (Trainer *)operator_new(0xa8);
    *(undefined8 *)(sgd + 8) = 0x3f8000003f800000;
    *(undefined8 *)(sgd + 0x10) = 0;
    sgd[0x18] = (Trainer)0x1;
    *(undefined4 *)(sgd + 0x1c) = 0x40a00000;
    *(undefined1 (*) [16])(sgd + 0x20) = ZEXT816(0) << 0x20;
    *(undefined2 *)(sgd + 0x30) = 1;
    *(Model **)(sgd + 0x38) = &model;
    *(code **)sgd = __cxa_finalize;
    *(undefined8 *)(sgd + 0x40) = 0x3f733333358637bd;
    *(undefined1 (*) [64])(sgd + 0x48) = ZEXT864(0) << 0x20;
    *(undefined1 (*) [64])(sgd + 0x68) = ZEXT864(0) << 0x20;
    break;
  case 4:
    sgd = (Trainer *)operator_new(0xb0);
    am._0_8_ = pLVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&am,"lr_eta","");
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pfVar24 = boost::any_cast<float_const&>(paVar15);
    fVar3 = *pfVar24;
    *(float *)(sgd + 8) = fVar3;
    *(float *)(sgd + 0xc) = fVar3;
    *(undefined8 *)(sgd + 0x10) = 0;
    sgd[0x18] = (Trainer)0x1;
    *(undefined4 *)(sgd + 0x1c) = 0x40a00000;
    *(undefined8 *)(sgd + 0x20) = 0;
    *(undefined8 *)(sgd + 0x28) = 0;
    *(undefined2 *)(sgd + 0x30) = 1;
    *(Model **)(sgd + 0x38) = &model;
    *(code **)sgd = boost::serialization::extended_type_info::key_unregister;
    *(undefined8 *)(sgd + 0x40) = 0x3f7fbe773f666666;
    *(undefined4 *)(sgd + 0x48) = 0x322bcc77;
    *(undefined1 (*) [64])(sgd + 0x50) = ZEXT864(0) << 0x20;
    *(undefined1 (*) [64])(sgd + 0x70) = ZEXT864(0) << 0x20;
joined_r0x00128e57:
    if ((LookupParameter *)am._0_8_ == pLVar2) break;
    goto LAB_0012902e;
  default:
    sgd = (Trainer *)0x0;
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"lr_eta_decay","");
  paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  pfVar24 = boost::any_cast<float_const&>(paVar15);
  *(float *)(sgd + 0x10) = *pfVar24;
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  am._0_8_ = pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&am,"sparse_updates","");
  paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  pTVar25 = (Trainer *)boost::any_cast<bool_const&>(paVar15);
  sgd[0x30] = *pTVar25;
  if ((LookupParameter *)am._0_8_ != pLVar2) {
    operator_delete((void *)am._0_8_);
  }
  if (sgd[0x30] == (Trainer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Sparse updates for lookup parameter(s) to be disabled!",0x36);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"%% Using ",9);
  poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,flavour._M_dataplus._M_p,flavour._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20," recurrent units",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
  std::ostream::put((char)poVar20);
  std::ostream::flush();
  dynet::AttentionalModel<dynet::GRUBuilder>::AttentionalModel
            (&am,&model,SRC_VOCAB_SIZE,TGT_VOCAB_SIZE,LAYERS,HIDDEN_DIM,ALIGN_DIM,
             local_730 != p_Var1,bVar29,SUB81(local_738,0),SUB81(local_740,0),local_748 != p_Var1,
             cVar14._M_node == p_Var1);
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"test","");
  cVar17 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,&local_770);
  if (cVar17._M_node == p_Var1) {
    bVar29 = false;
  }
  else {
    local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"rescore","");
    cVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,&local_4b0);
    bVar29 = cVar17._M_node != p_Var1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p);
  }
  if (bVar29) {
    dynet::AttentionalModel<dynet::GRUBuilder>::add_fertility_params
              (&am,&model,HIDDEN_DIM,local_730 != p_Var1);
  }
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"initialise","");
  cVar17 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,&local_770);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p);
  }
  if (cVar17._M_node != p_Var1) {
    local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"initialise","");
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pbVar19 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
    initialise(&model,pbVar19);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._M_dataplus._M_p != &local_770.field_2) {
      operator_delete(local_770._M_dataplus._M_p);
    }
  }
  if (!bVar29 && cVar14._M_node != p_Var1) {
    dynet::AttentionalModel<dynet::GRUBuilder>::add_fertility_params
              (&am,&model,HIDDEN_DIM,local_730 != p_Var1);
  }
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"test","");
  cVar17 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,&local_770);
  if (cVar17._M_node == p_Var1) {
    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"kbest","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,&local_4d0);
    if (cVar18._M_node != p_Var1) goto LAB_00129438;
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"fert-stats","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,&local_4f0);
    bVar30 = cVar18._M_node == p_Var1;
    bVar29 = true;
  }
  else {
LAB_00129438:
    bVar29 = false;
    bVar30 = false;
  }
  if ((bVar29) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2)) {
    operator_delete(local_4f0._M_dataplus._M_p);
  }
  if ((cVar17._M_node == p_Var1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2)) {
    operator_delete(local_4d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p);
  }
  if (bVar30) {
    local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5f8,fname._M_dataplus._M_p,
               fname._M_dataplus._M_p + fname._M_string_length);
    local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"curriculum","");
    cVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,&local_770);
    local_728[0] = local_718;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_728,"epochs","");
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    piVar26 = boost::any_cast<int_const&>(paVar15);
    iVar5 = *piVar26;
    local_618[0] = local_608;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"coverage","");
    paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pfVar24 = boost::any_cast<float_const&>(paVar15);
    fVar3 = *pfVar24;
    local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"display","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,&local_510);
    train<dynet::AttentionalModel<dynet::GRUBuilder>>
              (&model,&am,&local_6c8,&local_708,sgd,&local_5f8,cVar17._M_node != p_Var1,iVar5,
               local_748 != p_Var1,fVar3,cVar18._M_node != p_Var1,cVar14._M_node != p_Var1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != &local_510.field_2) {
      operator_delete(local_510._M_dataplus._M_p);
    }
    if (local_618[0] != local_608) {
      operator_delete(local_618[0]);
    }
    if (local_728[0] != local_718) {
      operator_delete(local_728[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._M_dataplus._M_p != &local_770.field_2) {
      operator_delete(local_770._M_dataplus._M_p);
    }
    _Var28._M_p = local_5f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p == &local_5f8.field_2) goto LAB_001297bc;
  }
  else {
    local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"kbest","");
    cVar14 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,&local_770);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._M_dataplus._M_p != &local_770.field_2) {
      operator_delete(local_770._M_dataplus._M_p);
    }
    local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
    if (cVar14._M_node == p_Var1) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"test","");
      cVar14 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)this,&local_770);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_770._M_dataplus._M_p != &local_770.field_2) {
        operator_delete(local_770._M_dataplus._M_p);
      }
      local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
      if (cVar14._M_node == p_Var1) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"fert-stats","");
        cVar14 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)this,&local_770);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_770._M_dataplus._M_p != &local_770.field_2) {
          operator_delete(local_770._M_dataplus._M_p);
        }
        if (cVar14._M_node == p_Var1) goto LAB_001297bc;
        local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"fertility","");
        cVar14 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)this,&local_770);
        fert_stats<dynet::AttentionalModel<dynet::GRUBuilder>>
                  (&model,&am,&local_708,cVar14._M_node != p_Var1);
        _Var28._M_p = local_770._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_770._M_dataplus._M_p == &local_770.field_2) goto LAB_001297bc;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"rescore","");
        cVar14 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)this,&local_770);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_770._M_dataplus._M_p != &local_770.field_2) {
          operator_delete(local_770._M_dataplus._M_p);
        }
        if (cVar14._M_node != p_Var1) {
          test_rescore<dynet::AttentionalModel<dynet::GRUBuilder>>
                    (&model,&am,&local_6e8,local_748 != p_Var1);
          goto LAB_001297bc;
        }
        local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"test","");
        paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
        pbVar19 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
        pcVar9 = (pbVar19->_M_dataplus)._M_p;
        local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_550,pcVar9,pcVar9 + pbVar19->_M_string_length);
        local_728[0] = local_718;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_728,"beam","");
        paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
        puVar16 = boost::any_cast<unsigned_int_const&>(paVar15);
        test_decode<dynet::AttentionalModel<dynet::GRUBuilder>>
                  (&model,&am,&local_550,local_748 != p_Var1,*puVar16);
        if (local_728[0] != local_718) {
          operator_delete(local_728[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p);
        }
        _Var28._M_p = local_770._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_770._M_dataplus._M_p == &local_770.field_2) goto LAB_001297bc;
      }
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"kbest","");
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
      pbVar19 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
      pcVar9 = (pbVar19->_M_dataplus)._M_p;
      local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_530,pcVar9,pcVar9 + pbVar19->_M_string_length);
      local_728[0] = local_718;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_728,"topk","");
      paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
      puVar16 = boost::any_cast<unsigned_int_const&>(paVar15);
      test_kbest_arcs<dynet::AttentionalModel<dynet::GRUBuilder>>(&model,&am,&local_530,*puVar16);
      if (local_728[0] != local_718) {
        operator_delete(local_728[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p);
      }
      _Var28._M_p = local_770._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_770._M_dataplus._M_p == &local_770.field_2) goto LAB_001297bc;
    }
  }
  operator_delete(_Var28._M_p);
LAB_001297bc:
  if (sgd != (Trainer *)0x0) {
    (**(code **)(*(long *)sgd + 8))(sgd);
  }
  dynet::AttentionalModel<dynet::GRUBuilder>::~AttentionalModel(&am);
  dynet::Model::~Model(&model);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fname._M_dataplus._M_p != &fname.field_2) {
    operator_delete(fname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)line._M_dataplus._M_p != &line.field_2) {
    operator_delete(line._M_dataplus._M_p);
  }
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector(&local_6e8);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector(&local_708);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector(&local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flavour._M_dataplus._M_p != &flavour.field_2) {
    operator_delete(flavour._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main_body(variables_map vm)
{
    kSRC_SOS = sd.convert("<s>");
    kSRC_EOS = sd.convert("</s>");
    kTGT_SOS = td.convert("<s>");
    kTGT_EOS = td.convert("</s>");
    verbose = vm.count("verbose");

    LAYERS = vm["layers"].as<int>(); 
    ALIGN_DIM = vm["align"].as<int>(); 
    HIDDEN_DIM = vm["hidden"].as<int>(); 
    bool bidir = vm.count("bidirectional");
    bool giza = vm.count("giza");
    bool giza_pos = giza || vm.count("gz-position");
    bool giza_markov = giza || vm.count("gz-markov");
    bool giza_fert = giza || vm.count("gz-fertility");
    bool fert = vm.count("fertility");
    bool swap = vm.count("swap");
    bool doco = vm.count("document");
    string flavour = "RNN";
    if (vm.count("lstm"))	flavour = "LSTM";
    else if (vm.count("gru"))	flavour = "GRU";

    Corpus training, devel, testing;
    string line;
    cerr << "Reading training data from " << vm["train"].as<string>() << "...\n";
    training = read_corpus(vm["train"].as<string>(), doco);
    sd.freeze(); // no new word types allowed
    td.freeze(); // no new word types allowed
    
    SRC_VOCAB_SIZE = sd.size();
    TGT_VOCAB_SIZE = td.size();

    if (vm.count("devel")) {
	cerr << "Reading dev data from " << vm["devel"].as<string>() << "...\n";
	devel = read_corpus(vm["devel"].as<string>(), doco);
    }

    if (vm.count("test") && vm.count("rescore")) {
        // otherwise "test" file is assumed just to contain source language strings
        cerr << "Reading test examples from " << vm["test"].as<string>() << endl;
        testing = read_corpus(vm["test"].as<string>(), doco);
    }

    if (swap) {
	cerr << "Swapping role of source and target\n";
        std::swap(sd, td);
        std::swap(kSRC_SOS, kTGT_SOS);
        std::swap(kSRC_EOS, kTGT_EOS);
        std::swap(SRC_VOCAB_SIZE, TGT_VOCAB_SIZE);
        for (auto &sent: training)
            std::swap(get<0>(sent), get<1>(sent));
        for (auto &sent: devel)
            std::swap(get<0>(sent), get<1>(sent));
        for (auto &sent: testing)
            std::swap(get<0>(sent), get<1>(sent));
    }

    string fname;
    if (vm.count("parameters"))
    	fname = vm["parameters"].as<string>();
    else if (vm.count("initialise"))
    	fname = vm["initialise"].as<string>();
    else {
		ostringstream os;
		os << "am"
			<< '_' << LAYERS
			<< '_' << HIDDEN_DIM
			<< '_' << ALIGN_DIM
			<< '_' << flavour
			<< "_b" << bidir
			<< "_g" << (int)giza_pos << (int)giza_markov << (int)giza_fert
			<< "_d" << doco
			<< "-pid" << getpid() << ".params";
		fname = os.str();
	}

	cerr << "Parameters will be written to: " << fname << endl;

   Model model;
   Trainer* sgd = nullptr;
   unsigned sgd_type = vm["sgd_trainer"].as<unsigned>();
   if (sgd_type == 1)
       sgd = new MomentumSGDTrainer(model, vm["lr_eta"].as<float>());
   else if (sgd_type == 2)
       sgd = new AdagradTrainer(model, vm["lr_eta"].as<float>());
   else if (sgd_type == 3)
       sgd = new AdadeltaTrainer(model);
   else if (sgd_type == 4)
       sgd = new AdamTrainer(model, vm["lr_eta"].as<float>());
   else if (sgd_type == 0)//Vanilla SGD trainer
       sgd = new SimpleSGDTrainer(model, vm["lr_eta"].as<float>());
   else
       assert("Unknown SGD trainer type! (0: vanilla SGD; 1: momentum SGD; 2: Adagrad; 3: AdaDelta; 4: Adam)");
   sgd->eta_decay = vm["lr_eta_decay"].as<float>();
   sgd->sparse_updates_enabled = vm["sparse_updates"].as<bool>();
   if (!sgd->sparse_updates_enabled)
      cerr << "Sparse updates for lookup parameter(s) to be disabled!" << endl;

   cerr << "%% Using " << flavour << " recurrent units" << endl;
   AttentionalModel<rnn_t> am(&model, SRC_VOCAB_SIZE, TGT_VOCAB_SIZE,
	    LAYERS, HIDDEN_DIM, ALIGN_DIM, bidir, giza_pos, giza_markov, giza_fert, doco, !fert);

   bool add_fer = false;
   if (vm.count("test") && vm.count("rescore"))
   {
	   am.add_fertility_params(&model, HIDDEN_DIM, bidir);
	   add_fer = true;
   }

   if (vm.count("initialise")) initialise(model, vm["initialise"].as<string>());

   if (fert && !add_fer) am.add_fertility_params(&model, HIDDEN_DIM, bidir);

   if (!vm.count("test") && !vm.count("kbest") && !vm.count("fert-stats"))
    	train(model, am, training, devel, *sgd, fname, vm.count("curriculum"),
                vm["epochs"].as<int>(), doco, vm["coverage"].as<float>(), vm.count("display"),
                fert);
    else if (vm.count("kbest"))
    	test_kbest_arcs(model, am, vm["kbest"].as<string>(), vm["topk"].as<unsigned>());
    else if (vm.count("test")) {
        if (vm.count("rescore"))
            test_rescore(model, am, testing, doco);
        else // test
            test_decode(model, am, vm["test"].as<string>(), doco, vm["beam"].as<unsigned>());
    }
    else if (vm.count("fert-stats"))
        fert_stats(model, am, devel, vm.count("fertility"));

    delete sgd;

    //dynet::Free();

    return EXIT_SUCCESS;
}